

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall
SplitStringTest_random_long_trailing_two_delim_Test<char16_t>::TestBody
          (SplitStringTest_random_long_trailing_two_delim_Test<char16_t> *this)

{
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *this_00;
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  split_result;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> delim;
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  data;
  long *local_f8;
  AssertHelper local_f0 [8];
  internal local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_d8;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_b8;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_98;
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_78;
  
  make_delim_long<char16_t,std::__cxx11::u16string>(&local_b8,8,L'\0');
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)&local_98,local_b8._M_dataplus._M_p,
             local_b8._M_dataplus._M_p + local_b8._M_string_length);
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::RandomTestData(&local_78,&local_98,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 2 + 2);
  }
  std::operator+(&local_d8,&local_b8,&local_b8);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  _M_append(&local_78.m_str,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity * 2 + 2);
  }
  this_00 = &local_78.m_tokens;
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::emplace_back<>(this_00);
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::emplace_back<>(this_00);
  jessilib::
  split<std::vector,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
            ((container_type *)&local_d8,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_78.m_str._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_78.m_str._M_dataplus._M_p + local_78.m_str._M_string_length),
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_b8._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_b8._M_dataplus._M_p + local_b8._M_string_length));
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>
            (local_e8,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)&local_d8,this_00);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x10b,pcVar1);
    testing::internal::AssertHelper::operator=(local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if (local_f8 != (long *)0x0) {
      (**(code **)(*local_f8 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
             *)&local_d8);
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78.m_str._M_dataplus._M_p != &local_78.m_str.field_2) {
    operator_delete(local_78.m_str._M_dataplus._M_p,
                    local_78.m_str.field_2._M_allocated_capacity * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78.m_delim._M_dataplus._M_p != &local_78.m_delim.field_2) {
    operator_delete(local_78.m_delim._M_dataplus._M_p,
                    local_78.m_delim.field_2._M_allocated_capacity * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_long_trailing_two_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomTestData<TypeParam> data{ delim };
	data.m_str += delim + delim;
	data.m_tokens.emplace_back();
	data.m_tokens.emplace_back();
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}